

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12a29d3::ActivityObserver::register_drive(ActivityObserver *this,string *name)

{
  std::mutex::lock(&this->mutex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->drives_,name);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void register_drive(const std::string &name) final {
			std::lock_guard lock_guard(mutex);
			drives_.push_back(name);
		}